

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O2

void G_SerializeLevel(FSerializer *arc,bool hubload)

{
  uint uVar1;
  FSerializer *pFVar2;
  int i_1;
  long lVar3;
  int i_2;
  long lVar4;
  undefined8 *puVar5;
  undefined1 auVar6 [16];
  int i;
  BYTE chk [16];
  
  i = level.totaltime;
  if (arc->w == (FWriter *)0x0) {
    chk[0] = '\0';
    chk[1] = '\0';
    chk[2] = '\0';
    chk[3] = '\0';
    chk[4] = '\0';
    chk[5] = '\0';
    chk[6] = '\0';
    chk[7] = '\0';
    chk[8] = '\0';
    chk[9] = '\0';
    chk[10] = '\0';
    chk[0xb] = '\0';
    chk[0xc] = '\0';
    chk[0xd] = '\0';
    chk[0xe] = '\0';
    chk[0xf] = '\0';
    FSerializer::Array<unsigned_char>(arc,"checksum",chk,0x10,false);
    uVar1 = FSerializer::GetSize(arc,"linedefs");
    if (uVar1 == numlines) {
      uVar1 = FSerializer::GetSize(arc,"sidedefs");
      if (uVar1 == numsides) {
        uVar1 = FSerializer::GetSize(arc,"sectors");
        if (uVar1 == numsectors) {
          uVar1 = FSerializer::GetSize(arc,"polyobjs");
          if ((uVar1 == po_NumPolyobjs) &&
             (auVar6[0] = -(level.md5[0] == chk[0]), auVar6[1] = -(level.md5[1] == chk[1]),
             auVar6[2] = -(level.md5[2] == chk[2]), auVar6[3] = -(level.md5[3] == chk[3]),
             auVar6[4] = -(level.md5[4] == chk[4]), auVar6[5] = -(level.md5[5] == chk[5]),
             auVar6[6] = -(level.md5[6] == chk[6]), auVar6[7] = -(level.md5[7] == chk[7]),
             auVar6[8] = -(level.md5[8] == chk[8]), auVar6[9] = -(level.md5[9] == chk[9]),
             auVar6[10] = -(level.md5[10] == chk[10]), auVar6[0xb] = -(level.md5[0xb] == chk[0xb]),
             auVar6[0xc] = -(level.md5[0xc] == chk[0xc]),
             auVar6[0xd] = -(level.md5[0xd] == chk[0xd]),
             auVar6[0xe] = -(level.md5[0xe] == chk[0xe]),
             auVar6[0xf] = -(level.md5[0xf] == chk[0xf]),
             (ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                     (ushort)(auVar6[0xf] >> 7) << 0xf) == 0xffff)) goto LAB_00440093;
        }
      }
    }
    I_Error("Savegame is from a different level");
  }
  else {
    FSerializer::Array<unsigned_char>(arc,"checksum",level.md5,0x10,false);
  }
LAB_00440093:
  FSerializer::operator()(arc,"saveversion",&SaveVersion);
  (*Renderer->_vptr_FRenderer[9])(Renderer,arc);
  if (arc->r != (FReader *)0x0) {
    DThinker::DestroyAllThinkers();
    FInterpolator::ClearInterpolations(&interpolator);
    FSerializer::ReadObjects(arc,hubload);
  }
  pFVar2 = FSerializer::operator()(arc,"level.flags",&level.flags);
  pFVar2 = FSerializer::operator()(pFVar2,"level.flags2",&level.flags2);
  pFVar2 = FSerializer::operator()(pFVar2,"level.fadeto",&level.fadeto);
  pFVar2 = FSerializer::operator()(pFVar2,"level.found_secrets",&level.found_secrets);
  pFVar2 = FSerializer::operator()(pFVar2,"level.found_items",&level.found_items);
  pFVar2 = FSerializer::operator()(pFVar2,"level.killed_monsters",&level.killed_monsters);
  pFVar2 = FSerializer::operator()(pFVar2,"level.total_secrets",&level.total_secrets);
  pFVar2 = FSerializer::operator()(pFVar2,"level.total_items",&level.total_items);
  pFVar2 = FSerializer::operator()(pFVar2,"level.total_monsters",&level.total_monsters);
  pFVar2 = FSerializer::operator()(pFVar2,"level.gravity",&level.gravity);
  pFVar2 = FSerializer::operator()(pFVar2,"level.aircontrol",&level.aircontrol);
  pFVar2 = FSerializer::operator()(pFVar2,"level.teamdamage",&level.teamdamage);
  pFVar2 = FSerializer::operator()(pFVar2,"level.maptime",&level.maptime);
  pFVar2 = FSerializer::operator()(pFVar2,"level.totaltime",&i);
  pFVar2 = FSerializer::operator()(pFVar2,"level.skytexture1",&level.skytexture1);
  FSerializer::operator()(pFVar2,"level.skytexture2",&level.skytexture2);
  if (!hubload) {
    level.totaltime = i;
  }
  if (arc->r != (FReader *)0x0) {
    sky1texture = level.skytexture1;
    sky2texture = level.skytexture2;
    R_InitSkyMap();
    G_AirControlChanged();
  }
  FBehavior::StaticSerializeModuleStates(arc);
  FSerializer::Array<line_t>(arc,"linedefs",lines,loadlines.Array,numlines,false);
  FSerializer::Array<side_t>(arc,"sidedefs",sides,loadsides.Array,numsides,false);
  FSerializer::Array<sector_t>(arc,"sectors",sectors,loadsectors.Array,numsectors,false);
  FSerializer::operator()(arc,"zones",&Zones);
  FSerializer::operator()(arc,"lineportals",&linePortals);
  FSerializer::operator()(arc,"sectorportals",&sectorPortals);
  if (arc->r != (FReader *)0x0) {
    P_CollectLinkedPortals();
  }
  DThinker::SerializeThinkers(arc,!hubload);
  FSerializer::Array<FPolyObj>(arc,"polyobjs",polyobjs,po_NumPolyobjs,false);
  FSerializer::operator()(arc,"subsectors",&subsectors);
  DBaseStatusBar::SerializeMessages(StatusBar,arc);
  AM_SerializeMarkers(arc);
  FRemapTable::StaticSerializeTranslations(arc);
  FCanvasTextureInfo::Serialize(arc);
  P_SerializePlayers(arc,hubload);
  P_SerializeSounds(arc);
  if (arc->r != (FReader *)0x0) {
    lVar4 = 0;
    for (lVar3 = 0; lVar3 < numsectors; lVar3 = lVar3 + 1) {
      P_Recalculate3DFloors((sector_t_conflict *)((long)&sectors->planes[0].xform.xOffs + lVar4));
      lVar4 = lVar4 + 0x218;
    }
    puVar5 = &players;
    for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
      if ((playeringame[lVar3] == true) && ((APlayerPawn *)*puVar5 != (APlayerPawn *)0x0)) {
        APlayerPawn::SetupWeaponSlots((APlayerPawn *)*puVar5);
      }
      puVar5 = puVar5 + 0x54;
    }
  }
  (*Renderer->_vptr_FRenderer[10])(Renderer,arc);
  return;
}

Assistant:

void G_SerializeLevel(FSerializer &arc, bool hubload)
{
	int i = level.totaltime;

	if (arc.isWriting())
	{
		arc.Array("checksum", level.md5, 16);
	}
	else
	{
		// prevent bad things from happening by doing a check on the size of level arrays and the map's entire checksum.
		// The old code happily tried to load savegames with any mismatch here, often causing meaningless errors
		// deep down in the deserializer or just a crash if the few insufficient safeguards were not triggered.
		BYTE chk[16] = { 0 };
		arc.Array("checksum", chk, 16);
		if (arc.GetSize("linedefs") != (unsigned)numlines ||
			arc.GetSize("sidedefs") != (unsigned)numsides ||
			arc.GetSize("sectors") != (unsigned)numsectors ||
			arc.GetSize("polyobjs") != (unsigned)po_NumPolyobjs ||
			memcmp(chk, level.md5, 16))
		{
			I_Error("Savegame is from a different level");
		}
	}
	arc("saveversion", SaveVersion);

	Renderer->StartSerialize(arc);
	if (arc.isReading())
	{
		DThinker::DestroyAllThinkers();
		interpolator.ClearInterpolations();
		arc.ReadObjects(hubload);
	}

	arc("level.flags", level.flags)
		("level.flags2", level.flags2)
		("level.fadeto", level.fadeto)
		("level.found_secrets", level.found_secrets)
		("level.found_items", level.found_items)
		("level.killed_monsters", level.killed_monsters)
		("level.total_secrets", level.total_secrets)
		("level.total_items", level.total_items)
		("level.total_monsters", level.total_monsters)
		("level.gravity", level.gravity)
		("level.aircontrol", level.aircontrol)
		("level.teamdamage", level.teamdamage)
		("level.maptime", level.maptime)
		("level.totaltime", i)
		("level.skytexture1", level.skytexture1)
		("level.skytexture2", level.skytexture2);

	// Hub transitions must keep the current total time
	if (!hubload)
		level.totaltime = i;

	if (arc.isReading())
	{
		sky1texture = level.skytexture1;
		sky2texture = level.skytexture2;
		R_InitSkyMap();
		G_AirControlChanged();
	}



	// fixme: This needs to ensure it reads from the correct place. Should be one once there's enough of this code converted to JSON

	FBehavior::StaticSerializeModuleStates(arc);
	// The order here is important: First world state, then portal state, then thinkers, and last polyobjects.
	arc.Array("linedefs", lines, &loadlines[0], numlines);
	arc.Array("sidedefs", sides, &loadsides[0], numsides);
	arc.Array("sectors", sectors, &loadsectors[0], numsectors);
	arc("zones", Zones);
	arc("lineportals", linePortals);
	arc("sectorportals", sectorPortals);
	if (arc.isReading()) P_CollectLinkedPortals();

	DThinker::SerializeThinkers(arc, !hubload);
	arc.Array("polyobjs", polyobjs, po_NumPolyobjs);
	arc("subsectors", subsectors);
	StatusBar->SerializeMessages(arc);
	AM_SerializeMarkers(arc);
	FRemapTable::StaticSerializeTranslations(arc);
	FCanvasTextureInfo::Serialize(arc);
	P_SerializePlayers(arc, hubload);
	P_SerializeSounds(arc);

	if (arc.isReading())
	{
		for (int i = 0; i < numsectors; i++)
		{
			P_Recalculate3DFloors(&sectors[i]);
		}
		for (int i = 0; i < MAXPLAYERS; ++i)
		{
			if (playeringame[i] && players[i].mo != NULL)
			{
				players[i].mo->SetupWeaponSlots();
			}
		}
	}
	Renderer->EndSerialize(arc);

}